

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

QTextStream * CPP::operator<<(QTextStream *str,iconFromThemeStringLiteral *i)

{
  QTextStream *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  _string<true> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QTextStream *)QTextStream::operator<<(str,"QIcon");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)language::qualifier);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,"fromTheme(");
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_38.m_value = &i->m_theme;
  local_38.m_indent = (QString *)&local_58;
  language::_string<true>::format(&local_38,pQVar1);
  QTextStream::operator<<(pQVar1,')');
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return str;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &operator<<(QTextStream &str, const iconFromThemeStringLiteral &i)
{
    str << "QIcon" << language::qualifier << "fromTheme(" << language::qstring(i.m_theme) << ')';
    return str;
}